

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

VmConstant * CreateConstantVoid(Allocator *allocator)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
  VmConstant::VmConstant
            ((VmConstant *)CONCAT44(extraout_var,iVar1),allocator,(VmType)ZEXT816((ulong)0),
             (SynBase *)0x0);
  return (VmConstant *)CONCAT44(extraout_var,iVar1);
}

Assistant:

VmConstant* CreateConstantVoid(Allocator *allocator)
{
	return new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Void, NULL);
}